

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::WireFormat::InternalSerializeField
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  int iVar1;
  double dVar2;
  KeyValue *pKVar3;
  bool bVar4;
  char cVar5;
  CppType CVar6;
  uint uVar7;
  Type TVar8;
  int iVar9;
  uint32 uVar10;
  int32 iVar11;
  uint uVar12;
  MapFieldBase *this;
  RepeatedField<double> *other;
  string *psVar13;
  uint64 uVar14;
  EnumValueDescriptor *pEVar15;
  uint32 *puVar16;
  uint64 *puVar17;
  undefined4 extraout_var;
  Message *pMVar18;
  undefined4 extraout_var_00;
  uint8 *puVar19;
  RepeatedField<long> *pRVar20;
  size_t sVar21;
  RepeatedField<int> *pRVar22;
  RepeatedField<unsigned_long> *pRVar23;
  RepeatedField<float> *other_00;
  RepeatedField<bool> *other_01;
  RepeatedField<unsigned_int> *pRVar24;
  LogMessage *other_02;
  long lVar25;
  byte *pbVar26;
  byte *pbVar27;
  uint uVar28;
  ulong uVar29;
  Reflection *extraout_RDX;
  pointer __src;
  size_type __n;
  uint8 *puVar30;
  pointer pMVar31;
  ulong uVar32;
  undefined4 uVar33;
  float fVar34;
  undefined4 uVar35;
  uint8 *target_local;
  Message *local_d0;
  Reflection *local_c8;
  byte *local_c0;
  ulong local_b8;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapValueRef local_90;
  string *local_78;
  EpsCopyOutputStream *local_70;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  map_entries;
  
  target_local = target;
  local_d0 = message;
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_c8 = extraout_RDX;
  if ((((field[0x42] == (FieldDescriptor)0x1) &&
       (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) &&
      (CVar6 = FieldDescriptor::cpp_type(field), CVar6 == CPPTYPE_MESSAGE)) &&
     (*(int *)(field + 0x3c) != 3)) {
    puVar19 = InternalSerializeMessageSetItem(field,local_d0,target,stream);
    return puVar19;
  }
  bVar4 = FieldDescriptor::is_map(field);
  local_70 = stream;
  if (bVar4) {
    this = Reflection::GetMapData(local_c8,local_d0,field);
    bVar4 = MapFieldBase::IsMapValid(this);
    if (bVar4) {
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey(&sorted_key_list,local_d0,local_c8,field);
        for (; sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish;
            sorted_key_list.
            super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 sorted_key_list.
                 super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1) {
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          map_entries.
          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)map_entries.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          Reflection::InsertOrLookupMapValue
                    (local_c8,local_d0,field,
                     sorted_key_list.
                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                     ._M_impl.super__Vector_impl_data._M_start,(MapValueRef *)&map_entries);
          target_local = InternalSerializeMapEntry
                                   (field,sorted_key_list.
                                          super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                    (MapValueRef *)&map_entries,target_local,stream);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  (&sorted_key_list);
        return target_local;
      }
      Reflection::MapBegin((MapIterator *)&sorted_key_list,local_c8,local_d0,field);
      while( true ) {
        Reflection::MapEnd((MapIterator *)&map_entries,local_c8,local_d0,field);
        cVar5 = (**(code **)(((sorted_key_list.
                               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->val_).int64_value_ +
                            0x28))(sorted_key_list.
                                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (MapIterator *)&sorted_key_list,(MapIterator *)&map_entries);
        MapIterator::~MapIterator((MapIterator *)&map_entries);
        if (cVar5 != '\0') break;
        target_local = InternalSerializeMapEntry
                                 (field,(MapKey *)
                                        &sorted_key_list.
                                         super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &local_90,target_local,local_70);
        (**(code **)(((sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->val_).int64_value_ + 0x90))
                  (sorted_key_list.
                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(MapIterator *)&sorted_key_list);
      }
      MapIterator::~MapIterator((MapIterator *)&sorted_key_list);
      return target_local;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar7 = Reflection::FieldSize(local_c8,local_d0,field);
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((1 < (int)uVar7) && (bVar4 = FieldDescriptor::is_map(field), bVar4)) &&
       (stream->is_serialization_deterministic_ == true)) {
      DynamicMapSorter::Sort
                ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                  *)&sorted_key_list,local_d0,uVar7,local_c8,field);
      std::
      vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::_M_move_assign(&map_entries,
                       (_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                        *)&sorted_key_list);
      std::
      _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
      ::~_Vector_base((_Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                       *)&sorted_key_list);
    }
  }
  else {
    if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
      bVar4 = Reflection::HasField(local_c8,local_d0,field);
      uVar7 = (uint)bVar4;
    }
    else {
      uVar7 = 1;
    }
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    map_entries.
    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  bVar4 = FieldDescriptor::is_packed(field);
  if (!bVar4) {
    local_b8 = 0;
    uVar32 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar32 = 0;
    }
    for (; local_b8 != uVar32; local_b8 = local_b8 + 1) {
      io::EpsCopyOutputStream::EnsureSpace(stream,&target_local);
      TVar8 = FieldDescriptor::type(field);
      iVar9 = (int)local_b8;
      switch(TVar8) {
      case TYPE_DOUBLE:
        if (*(int *)(field + 0x3c) == 3) {
          dVar2 = Reflection::GetRepeatedDouble(local_c8,local_d0,field,iVar9);
          uVar33 = SUB84(dVar2,0);
          uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        else {
          dVar2 = Reflection::GetDouble(local_c8,local_d0,field);
          uVar33 = SUB84(dVar2,0);
          uVar35 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        local_78 = (string *)CONCAT44(uVar35,uVar33);
        puVar17 = (uint64 *)
                  io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) * 8 + 1,target_local);
        *puVar17 = (uint64)local_78;
        goto LAB_00288a19;
      case TYPE_FLOAT:
        if (*(int *)(field + 0x3c) == 3) {
          fVar34 = Reflection::GetRepeatedFloat(local_c8,local_d0,field,iVar9);
        }
        else {
          fVar34 = Reflection::GetFloat(local_c8,local_d0,field);
        }
        local_78 = (string *)CONCAT44(local_78._4_4_,fVar34);
        puVar16 = (uint32 *)
                  io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) * 8 + 5,target_local);
        *puVar16 = (uint32)local_78;
        goto LAB_00288a80;
      case TYPE_INT64:
        if (*(int *)(field + 0x3c) == 3) {
          uVar14 = Reflection::GetRepeatedInt64(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar14 = Reflection::GetInt64(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint64ToArray(uVar14,puVar19);
        break;
      case TYPE_UINT64:
        if (*(int *)(field + 0x3c) == 3) {
          uVar14 = Reflection::GetRepeatedUInt64(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar14 = Reflection::GetUInt64(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint64ToArray(uVar14,puVar19);
        break;
      case TYPE_INT32:
        if (*(int *)(field + 0x3c) == 3) {
          iVar11 = Reflection::GetRepeatedInt32(local_c8,local_d0,field,iVar9);
        }
        else {
          iVar11 = Reflection::GetInt32(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar11,puVar19);
        break;
      case TYPE_FIXED64:
        if (*(int *)(field + 0x3c) == 3) {
          uVar14 = Reflection::GetRepeatedUInt64(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar14 = Reflection::GetUInt64(local_c8,local_d0,field);
        }
        puVar17 = (uint64 *)
                  io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) * 8 + 1,target_local);
        goto LAB_00288a16;
      case TYPE_FIXED32:
        if (*(int *)(field + 0x3c) == 3) {
          uVar10 = Reflection::GetRepeatedUInt32(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar10 = Reflection::GetUInt32(local_c8,local_d0,field);
        }
        puVar16 = (uint32 *)
                  io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) * 8 + 5,target_local);
        goto LAB_00288a7e;
      case TYPE_BOOL:
        if (*(int *)(field + 0x3c) == 3) {
          bVar4 = Reflection::GetRepeatedBool(local_c8,local_d0,field,iVar9);
        }
        else {
          bVar4 = Reflection::GetBool(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar4,puVar19);
        break;
      case TYPE_STRING:
        iVar1 = *(int *)(*(long *)(field + 0x28) + 0x3c);
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)&sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        if (*(int *)(field + 0x3c) == 3) {
          psVar13 = Reflection::GetRepeatedStringReference
                              (local_c8,local_d0,field,iVar9,(string *)&sorted_key_list);
        }
        else {
          psVar13 = Reflection::GetStringReference
                              (local_c8,local_d0,field,(string *)&sorted_key_list);
        }
        if (iVar1 == 3) {
          WireFormatLite::VerifyUtf8String
                    ((psVar13->_M_dataplus)._M_p,(int)psVar13->_M_string_length,SERIALIZE,
                     (char *)**(undefined8 **)(field + 8));
        }
        puVar19 = target_local;
        uVar10 = *(uint32 *)(field + 0x44);
        __n = psVar13->_M_string_length;
        if ((long)__n < 0x80) {
          puVar30 = local_70->end_;
          uVar7 = uVar10 * 8;
          local_78 = psVar13;
          iVar9 = io::EpsCopyOutputStream::TagSize(uVar7);
          psVar13 = local_78;
          if ((long)__n <= (long)(puVar30 + ~(ulong)(puVar19 + iVar9) + 0x10)) {
            if (uVar7 < 0x80) {
              *puVar19 = (byte)uVar7 | 2;
              puVar19 = puVar19 + 1;
            }
            else {
              *puVar19 = (byte)uVar7 | 0x82;
              if (uVar7 < 0x4000) {
                puVar19[1] = (uint8)(uVar7 >> 7);
                puVar19 = puVar19 + 2;
              }
              else {
                puVar19 = puVar19 + 2;
                uVar7 = uVar7 >> 7;
                do {
                  puVar30 = puVar19;
                  puVar30[-1] = (byte)uVar7 | 0x80;
                  uVar28 = uVar7 >> 7;
                  puVar19 = puVar30 + 1;
                  bVar4 = 0x3fff < uVar7;
                  uVar7 = uVar28;
                } while (bVar4);
                *puVar30 = (uint8)uVar28;
              }
            }
            *puVar19 = (uint8)__n;
            __src = (local_78->_M_dataplus)._M_p;
LAB_00288bdc:
            memcpy(puVar19 + 1,__src,__n);
            target_local = puVar19 + __n + 1;
            stream = local_70;
            goto LAB_00288bf0;
          }
        }
        stream = local_70;
        target_local = io::EpsCopyOutputStream::WriteStringOutline(local_70,uVar10,psVar13,puVar19);
        goto LAB_00288bf0;
      case TYPE_GROUP:
        iVar1 = *(int *)(field + 0x44);
        if (*(int *)(field + 0x3c) == 3) {
          if (map_entries.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              map_entries.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pMVar18 = Reflection::GetRepeatedMessage(local_c8,local_d0,field,iVar9);
          }
          else {
            pMVar18 = map_entries.
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_b8];
          }
        }
        else {
          pMVar18 = Reflection::GetMessage(local_c8,local_d0,field,(MessageFactory *)0x0);
        }
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)target_local;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)io::CodedOutputStream::WriteVarint32ToArray(iVar1 * 8 + 3,target_local);
        iVar9 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[0xe])
                          (pMVar18,sorted_key_list.
                                   super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                   ._M_impl.super__Vector_impl_data._M_start,stream);
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar9);
        io::EpsCopyOutputStream::EnsureSpace(stream,(uint8 **)&sorted_key_list);
        target_local = io::CodedOutputStream::WriteVarint32ToArray
                                 (iVar1 << 3 | 4,
                                  (uint8 *)sorted_key_list.
                                           super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
        break;
      case TYPE_MESSAGE:
        iVar1 = *(int *)(field + 0x44);
        if (*(int *)(field + 0x3c) == 3) {
          if (map_entries.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              map_entries.
              super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pMVar18 = Reflection::GetRepeatedMessage(local_c8,local_d0,field,iVar9);
          }
          else {
            pMVar18 = map_entries.
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_b8];
          }
        }
        else {
          pMVar18 = Reflection::GetMessage(local_c8,local_d0,field,(MessageFactory *)0x0);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray(iVar1 * 8 + 2,target_local);
        uVar10 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[0xc])(pMVar18);
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray(uVar10,puVar19);
        iVar9 = (*(pMVar18->super_MessageLite)._vptr_MessageLite[0xe])(pMVar18,puVar19,stream);
        target_local = (uint8 *)CONCAT44(extraout_var_00,iVar9);
        break;
      case TYPE_BYTES:
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)&sorted_key_list.
                       super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sorted_key_list.
        super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        if (*(int *)(field + 0x3c) == 3) {
          psVar13 = Reflection::GetRepeatedStringReference
                              (local_c8,local_d0,field,iVar9,(string *)&sorted_key_list);
        }
        else {
          psVar13 = Reflection::GetStringReference
                              (local_c8,local_d0,field,(string *)&sorted_key_list);
        }
        puVar19 = target_local;
        uVar10 = *(uint32 *)(field + 0x44);
        __n = psVar13->_M_string_length;
        if ((long)__n < 0x80) {
          local_78 = (string *)local_70->end_;
          uVar7 = uVar10 * 8;
          iVar9 = io::EpsCopyOutputStream::TagSize(uVar7);
          if ((long)__n <= (long)((long)&local_78->field_2 + ~(ulong)(puVar19 + iVar9))) {
            if (uVar7 < 0x80) {
              *puVar19 = (byte)uVar7 | 2;
              puVar19 = puVar19 + 1;
            }
            else {
              *puVar19 = (byte)uVar7 | 0x82;
              if (uVar7 < 0x4000) {
                puVar19[1] = (uint8)(uVar7 >> 7);
                puVar19 = puVar19 + 2;
              }
              else {
                puVar19 = puVar19 + 2;
                uVar7 = uVar7 >> 7;
                do {
                  puVar30 = puVar19;
                  puVar30[-1] = (byte)uVar7 | 0x80;
                  uVar28 = uVar7 >> 7;
                  puVar19 = puVar30 + 1;
                  bVar4 = 0x3fff < uVar7;
                  uVar7 = uVar28;
                } while (bVar4);
                *puVar30 = (uint8)uVar28;
              }
            }
            *puVar19 = (uint8)__n;
            __src = (psVar13->_M_dataplus)._M_p;
            goto LAB_00288bdc;
          }
        }
        stream = local_70;
        target_local = io::EpsCopyOutputStream::WriteStringOutline(local_70,uVar10,psVar13,puVar19);
LAB_00288bf0:
        std::__cxx11::string::~string((string *)&sorted_key_list);
        break;
      case TYPE_UINT32:
        if (*(int *)(field + 0x3c) == 3) {
          uVar10 = Reflection::GetRepeatedUInt32(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar10 = Reflection::GetUInt32(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint32ToArray(uVar10,puVar19);
        break;
      case TYPE_ENUM:
        if (*(int *)(field + 0x3c) == 3) {
          pEVar15 = Reflection::GetRepeatedEnum(local_c8,local_d0,field,iVar9);
        }
        else {
          pEVar15 = Reflection::GetEnum(local_c8,local_d0,field);
        }
        iVar11 = *(int32 *)(pEVar15 + 0x10);
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar11,puVar19);
        break;
      case TYPE_SFIXED32:
        if (*(int *)(field + 0x3c) == 3) {
          uVar10 = Reflection::GetRepeatedInt32(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar10 = Reflection::GetInt32(local_c8,local_d0,field);
        }
        puVar16 = (uint32 *)
                  io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) * 8 + 5,target_local);
LAB_00288a7e:
        *puVar16 = uVar10;
LAB_00288a80:
        target_local = (uint8 *)(puVar16 + 1);
        break;
      case TYPE_SFIXED64:
        if (*(int *)(field + 0x3c) == 3) {
          uVar14 = Reflection::GetRepeatedInt64(local_c8,local_d0,field,iVar9);
        }
        else {
          uVar14 = Reflection::GetInt64(local_c8,local_d0,field);
        }
        puVar17 = (uint64 *)
                  io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) * 8 + 1,target_local);
LAB_00288a16:
        *puVar17 = uVar14;
LAB_00288a19:
        target_local = (uint8 *)(puVar17 + 1);
        break;
      case TYPE_SINT32:
        if (*(int *)(field + 0x3c) == 3) {
          iVar9 = Reflection::GetRepeatedInt32(local_c8,local_d0,field,iVar9);
        }
        else {
          iVar9 = Reflection::GetInt32(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint32ToArray
                                 (iVar9 >> 0x1f ^ iVar9 * 2,puVar19);
        break;
      case MAX_TYPE:
        if (*(int *)(field + 0x3c) == 3) {
          lVar25 = Reflection::GetRepeatedInt64(local_c8,local_d0,field,iVar9);
        }
        else {
          lVar25 = Reflection::GetInt64(local_c8,local_d0,field);
        }
        puVar19 = io::CodedOutputStream::WriteVarint32ToArray
                            (*(int *)(field + 0x44) << 3,target_local);
        target_local = io::CodedOutputStream::WriteVarint64ToArray
                                 (lVar25 >> 0x3f ^ lVar25 * 2,puVar19);
      }
    }
    goto LAB_00289d64;
  }
  if (uVar7 == 0) goto LAB_00289d64;
  io::EpsCopyOutputStream::EnsureSpace(stream,&target_local);
  TVar8 = FieldDescriptor::type(field);
  switch(TVar8) {
  case TYPE_DOUBLE:
    other = Reflection::GetRepeatedField<double>(local_c8,local_d0,field);
    RepeatedField<double>::RepeatedField((RepeatedField<double> *)&sorted_key_list,other);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar27 = (byte)uVar28;
      }
    }
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start << 3;
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    target_local = io::EpsCopyOutputStream::WriteRaw
                             (stream,sorted_key_list.
                                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                              (uint)sorted_key_list.
                                    super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start << 3,local_c0);
    RepeatedField<double>::~RepeatedField((RepeatedField<double> *)&sorted_key_list);
    break;
  case TYPE_FLOAT:
    other_00 = Reflection::GetRepeatedField<float>(local_c8,local_d0,field);
    RepeatedField<float>::RepeatedField((RepeatedField<float> *)&sorted_key_list,other_00);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar27 = (byte)uVar28;
      }
    }
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start << 2;
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    target_local = io::EpsCopyOutputStream::WriteRaw
                             (stream,sorted_key_list.
                                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                              (uint)sorted_key_list.
                                    super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start << 2,local_c0);
    RepeatedField<float>::~RepeatedField((RepeatedField<float> *)&sorted_key_list);
    break;
  case TYPE_INT64:
    pRVar20 = Reflection::GetRepeatedField<long>(local_c8,local_d0,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&sorted_key_list,pRVar20);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar32 = (pMVar31->val_).uint64_value_;
      if (uVar32 < 0x80) {
        *local_c0 = (byte)uVar32;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar32 | 0x80;
        if (uVar32 < 0x4000) {
          local_c0[1] = (byte)(uVar32 >> 7);
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          uVar32 = uVar32 >> 7;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar32 | 0x80;
            uVar29 = uVar32 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar32;
            uVar32 = uVar29;
          } while (bVar4);
          *pbVar27 = (byte)uVar29;
        }
      }
      pMVar31 = (pointer)&pMVar31->type_;
      local_c0 = pbVar26;
    } while (pMVar31 < pKVar3 + lVar25);
    goto LAB_00289bf5;
  case TYPE_UINT64:
    pRVar23 = Reflection::GetRepeatedField<unsigned_long>(local_c8,local_d0,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)&sorted_key_list,pRVar23);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar32 = (pMVar31->val_).uint64_value_;
      if (uVar32 < 0x80) {
        *local_c0 = (byte)uVar32;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar32 | 0x80;
        if (uVar32 < 0x4000) {
          local_c0[1] = (byte)(uVar32 >> 7);
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          uVar32 = uVar32 >> 7;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar32 | 0x80;
            uVar29 = uVar32 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar32;
            uVar32 = uVar29;
          } while (bVar4);
          *pbVar27 = (byte)uVar29;
        }
      }
      pMVar31 = (pointer)&pMVar31->type_;
      local_c0 = pbVar26;
    } while (pMVar31 < pKVar3 + lVar25);
    goto LAB_00289b41;
  case TYPE_INT32:
    pRVar22 = Reflection::GetRepeatedField<int>(local_c8,local_d0,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&sorted_key_list,pRVar22);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar7 = (pMVar31->val_).uint32_value_;
      if ((ulong)(long)(int)uVar7 < 0x80) {
        *local_c0 = (byte)uVar7;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar7 | 0x80;
        uVar32 = (ulong)(long)(int)uVar7 >> 7;
        if (uVar7 < 0x4000) {
          local_c0[1] = (byte)uVar32;
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar32 | 0x80;
            uVar29 = uVar32 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar32;
            uVar32 = uVar29;
          } while (bVar4);
          *pbVar27 = (byte)uVar29;
        }
      }
      pMVar31 = (pointer)((long)&pMVar31->val_ + 4);
      local_c0 = pbVar26;
    } while (pMVar31 < (pointer)((long)pKVar3 + lVar25 * 4));
    goto LAB_00289ca9;
  case TYPE_FIXED64:
    pRVar23 = Reflection::GetRepeatedField<unsigned_long>(local_c8,local_d0,field);
    RepeatedField<unsigned_long>::RepeatedField
              ((RepeatedField<unsigned_long> *)&sorted_key_list,pRVar23);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar27 = (byte)uVar28;
      }
    }
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start << 3;
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    pbVar26 = io::EpsCopyOutputStream::WriteRaw
                        (stream,sorted_key_list.
                                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                         (uint)sorted_key_list.
                               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                               ._M_impl.super__Vector_impl_data._M_start << 3,local_c0);
LAB_00289b41:
    target_local = pbVar26;
    RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)&sorted_key_list);
    break;
  case TYPE_FIXED32:
    pRVar24 = Reflection::GetRepeatedField<unsigned_int>(local_c8,local_d0,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)&sorted_key_list,pRVar24);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar27 = (byte)uVar28;
      }
    }
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start << 2;
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    pbVar26 = io::EpsCopyOutputStream::WriteRaw
                        (stream,sorted_key_list.
                                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                         (uint)sorted_key_list.
                               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                               ._M_impl.super__Vector_impl_data._M_start << 2,local_c0);
    goto LAB_00289d56;
  case TYPE_BOOL:
    other_01 = Reflection::GetRepeatedField<bool>(local_c8,local_d0,field);
    RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)&sorted_key_list,other_01);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar28 = iVar9 << 3;
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar28 < 0x80) {
      *local_c0 = (byte)uVar28 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar28 | 0x82;
      if (uVar28 < 0x4000) {
        local_c0[1] = (byte)(uVar28 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar28 = uVar28 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar28 | 0x80;
          uVar12 = uVar28 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar28;
          uVar28 = uVar12;
        } while (bVar4);
        *pbVar27 = (byte)uVar12;
      }
    }
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    target_local = io::EpsCopyOutputStream::WriteRaw
                             (stream,sorted_key_list.
                                     super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,
                              (uint)sorted_key_list.
                                    super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                    ._M_impl.super__Vector_impl_data._M_start,local_c0);
    RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)&sorted_key_list);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)&sorted_key_list,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x3ac);
    other_02 = LogMessage::operator<<((LogMessage *)&sorted_key_list,"Invalid descriptor");
    LogFinisher::operator=((LogFinisher *)&local_c0,other_02);
    LogMessage::~LogMessage((LogMessage *)&sorted_key_list);
    break;
  case TYPE_UINT32:
    pRVar24 = Reflection::GetRepeatedField<unsigned_int>(local_c8,local_d0,field);
    RepeatedField<unsigned_int>::RepeatedField
              ((RepeatedField<unsigned_int> *)&sorted_key_list,pRVar24);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar7 = (pMVar31->val_).uint32_value_;
      if (uVar7 < 0x80) {
        *local_c0 = (byte)uVar7;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          local_c0[1] = (byte)(uVar7 >> 7);
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          uVar7 = uVar7 >> 7;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar7 | 0x80;
            uVar28 = uVar7 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar28;
          } while (bVar4);
          *pbVar27 = (byte)uVar28;
        }
      }
      pMVar31 = (pointer)((long)&pMVar31->val_ + 4);
      local_c0 = pbVar26;
    } while (pMVar31 < (pointer)((long)pKVar3 + lVar25 * 4));
LAB_00289d56:
    target_local = pbVar26;
    RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)&sorted_key_list);
    break;
  case TYPE_ENUM:
    pRVar22 = Reflection::GetRepeatedField<int>(local_c8,local_d0,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&sorted_key_list,pRVar22);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar7 = (pMVar31->val_).uint32_value_;
      if ((ulong)(long)(int)uVar7 < 0x80) {
        *local_c0 = (byte)uVar7;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar7 | 0x80;
        uVar32 = (ulong)(long)(int)uVar7 >> 7;
        if (uVar7 < 0x4000) {
          local_c0[1] = (byte)uVar32;
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar32 | 0x80;
            uVar29 = uVar32 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar32;
            uVar32 = uVar29;
          } while (bVar4);
          *pbVar27 = (byte)uVar29;
        }
      }
      pMVar31 = (pointer)((long)&pMVar31->val_ + 4);
      local_c0 = pbVar26;
    } while (pMVar31 < (pointer)((long)pKVar3 + lVar25 * 4));
    goto LAB_00289ca9;
  case TYPE_SFIXED32:
    pRVar22 = Reflection::GetRepeatedField<int>(local_c8,local_d0,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&sorted_key_list,pRVar22);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar27 = (byte)uVar28;
      }
    }
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start << 2;
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    pbVar26 = io::EpsCopyOutputStream::WriteRaw
                        (stream,sorted_key_list.
                                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                         (uint)sorted_key_list.
                               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                               ._M_impl.super__Vector_impl_data._M_start << 2,local_c0);
    goto LAB_00289ca9;
  case TYPE_SFIXED64:
    pRVar20 = Reflection::GetRepeatedField<long>(local_c8,local_d0,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&sorted_key_list,pRVar20);
    iVar9 = *(int *)(field + 0x44);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      pbVar26 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        pbVar26 = local_c0 + 2;
      }
      else {
        pbVar26 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar27 = pbVar26;
          pbVar27[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          pbVar26 = pbVar27 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar27 = (byte)uVar28;
      }
    }
    uVar7 = (uint)sorted_key_list.
                  super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                  ._M_impl.super__Vector_impl_data._M_start << 3;
    while( true ) {
      local_c0 = pbVar26 + 1;
      if (uVar7 < 0x80) break;
      *pbVar26 = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      pbVar26 = local_c0;
    }
    *pbVar26 = (byte)uVar7;
    pbVar26 = io::EpsCopyOutputStream::WriteRaw
                        (stream,sorted_key_list.
                                super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish,
                         (uint)sorted_key_list.
                               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                               ._M_impl.super__Vector_impl_data._M_start << 3,local_c0);
    goto LAB_00289bf5;
  case TYPE_SINT32:
    pRVar22 = Reflection::GetRepeatedField<int>(local_c8,local_d0,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)&sorted_key_list,pRVar22);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar7 = (pMVar31->val_).int32_value_ >> 0x1f ^ (pMVar31->val_).int32_value_ * 2;
      if (uVar7 < 0x80) {
        *local_c0 = (byte)uVar7;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          local_c0[1] = (byte)(uVar7 >> 7);
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          uVar7 = uVar7 >> 7;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar7 | 0x80;
            uVar28 = uVar7 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar28;
          } while (bVar4);
          *pbVar27 = (byte)uVar28;
        }
      }
      pMVar31 = (pointer)((long)&pMVar31->val_ + 4);
      local_c0 = pbVar26;
    } while (pMVar31 < (pointer)((long)pKVar3 + lVar25 * 4));
LAB_00289ca9:
    target_local = pbVar26;
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)&sorted_key_list);
    break;
  case MAX_TYPE:
    pRVar20 = Reflection::GetRepeatedField<long>(local_c8,local_d0,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)&sorted_key_list,pRVar20);
    iVar9 = *(int *)(field + 0x44);
    sVar21 = FieldDataOnlyByteSize(field,local_d0);
    local_c0 = target_local;
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
    uVar7 = iVar9 << 3;
    if (uVar7 < 0x80) {
      *local_c0 = (byte)uVar7 | 2;
      local_c0 = local_c0 + 1;
    }
    else {
      *local_c0 = (byte)uVar7 | 0x82;
      if (uVar7 < 0x4000) {
        local_c0[1] = (byte)(uVar7 >> 7);
        local_c0 = local_c0 + 2;
      }
      else {
        local_c0 = local_c0 + 2;
        uVar7 = uVar7 >> 7;
        do {
          pbVar26 = local_c0;
          pbVar26[-1] = (byte)uVar7 | 0x80;
          uVar28 = uVar7 >> 7;
          local_c0 = pbVar26 + 1;
          bVar4 = 0x3fff < uVar7;
          uVar7 = uVar28;
        } while (bVar4);
        *pbVar26 = (byte)uVar28;
      }
    }
    while( true ) {
      if ((uint)sVar21 < 0x80) break;
      *local_c0 = (byte)sVar21 | 0x80;
      sVar21 = (size_t)((uint)sVar21 >> 7);
      local_c0 = local_c0 + 1;
    }
    *local_c0 = (byte)sVar21;
    lVar25 = (long)(int)(uint)sorted_key_list.
                              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
                              ._M_impl.super__Vector_impl_data._M_start;
    pKVar3 = &(sorted_key_list.
               super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
               ._M_impl.super__Vector_impl_data._M_finish)->val_;
    pMVar31 = sorted_key_list.
              super__Vector_base<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_c0 = local_c0 + 1;
    do {
      io::EpsCopyOutputStream::EnsureSpace(stream,&local_c0);
      uVar32 = (pMVar31->val_).int64_value_ >> 0x3f ^ (pMVar31->val_).int64_value_ * 2;
      if (uVar32 < 0x80) {
        *local_c0 = (byte)uVar32;
        pbVar26 = local_c0 + 1;
      }
      else {
        *local_c0 = (byte)uVar32 | 0x80;
        if (uVar32 < 0x4000) {
          local_c0[1] = (byte)(uVar32 >> 7);
          pbVar26 = local_c0 + 2;
        }
        else {
          pbVar26 = local_c0 + 2;
          uVar32 = uVar32 >> 7;
          do {
            pbVar27 = pbVar26;
            pbVar27[-1] = (byte)uVar32 | 0x80;
            uVar29 = uVar32 >> 7;
            pbVar26 = pbVar27 + 1;
            bVar4 = 0x3fff < uVar32;
            uVar32 = uVar29;
          } while (bVar4);
          *pbVar27 = (byte)uVar29;
        }
      }
      pMVar31 = (pointer)&pMVar31->type_;
      local_c0 = pbVar26;
    } while (pMVar31 < pKVar3 + lVar25);
LAB_00289bf5:
    target_local = pbVar26;
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)&sorted_key_list);
  }
LAB_00289d64:
  puVar19 = target_local;
  std::
  _Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::~_Vector_base(&map_entries.
                   super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                 );
  return puVar19;
}

Assistant:

uint8* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                          const Message& message, uint8* target,
                                          io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                            \
        field->number(), r, FieldDataOnlyByteSize(field, message), target); \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);          \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        GOOGLE_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  for (int j = 0; j < count; j++) {
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                         \
  case FieldDescriptor::TYPE_##TYPE:                                           \
    target = WireFormatLite::InternalWrite##TYPE_METHOD##ToArray(              \
        field->number(),                                                       \
        field->is_repeated()                                                   \
            ? (map_entries.empty()                                             \
                   ? message_reflection->GetRepeated##CPPTYPE_METHOD(message,  \
                                                                     field, j) \
                   : *map_entries[j])                                          \
            : message_reflection->Get##CPPTYPE_METHOD(message, field),         \
        target, stream);                                                       \
    break;

      HANDLE_TYPE(GROUP, Group, Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}